

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O0

bool __thiscall aiMetadata::Get<float>(aiMetadata *this,string *key,float *value)

{
  bool bVar1;
  aiString local_424;
  float *local_20;
  float *value_local;
  string *key_local;
  aiMetadata *this_local;
  
  local_20 = value;
  value_local = (float *)key;
  key_local = (string *)this;
  aiString::aiString(&local_424,key);
  bVar1 = Get<float>(this,&local_424,local_20);
  return bVar1;
}

Assistant:

inline
    bool Get( const std::string& key, T& value ) const {
        return Get(aiString(key), value);
    }